

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * lexer::terminalName(string *__return_storage_ptr__,Terminal terminal,
                            TerminalNames *terminalNames)

{
  bool bVar1;
  pointer ppVar2;
  stringstream local_1b8 [8];
  stringstream stringstream;
  undefined1 local_1a8 [376];
  _Self local_30;
  _Self local_28;
  const_iterator it;
  TerminalNames *terminalNames_local;
  string *psStack_10;
  Terminal terminal_local;
  
  it._M_node = (_Base_ptr)terminalNames;
  terminalNames_local._4_4_ = terminal;
  psStack_10 = __return_storage_ptr__;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(terminalNames,(key_type *)((long)&terminalNames_local + 4));
  local_30._M_node =
       (_Base_ptr)
       std::
       map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(it._M_node);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::ostream::operator<<(local_1a8,terminalNames_local._4_4_);
    std::__cxx11::stringstream::str();
    std::__cxx11::stringstream::~stringstream(local_1b8);
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_28);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&ppVar2->second);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string terminalName(Terminal terminal, TerminalNames const& terminalNames) {
        TerminalNames::const_iterator it = terminalNames.find(terminal);
        if (it == terminalNames.end()) {
            std::stringstream stringstream;
            stringstream << terminal;
            return stringstream.str();
        }
        return it->second;
    }